

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int GetColorPalette(WebPPicture *pic,uint32_t *palette)

{
  int iVar1;
  int iVar2;
  void *in_RSI;
  long in_RDI;
  int key;
  uint32_t last_pix;
  int height;
  int width;
  uint32_t *argb;
  uint32_t colors [1024];
  uint8_t in_use [1024];
  int num_colors;
  int y;
  int x;
  int i;
  uint local_1440;
  uint local_143c;
  uint *local_1430;
  uint32_t local_1428 [1024];
  char local_428 [1024];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  void *local_18;
  long local_10;
  
  local_28 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_428,0,0x400);
  memset(local_1428,0,0x1000);
  local_1430 = *(uint **)(local_10 + 0x48);
  iVar1 = *(int *)(local_10 + 8);
  iVar2 = *(int *)(local_10 + 0xc);
  local_143c = *local_1430 ^ 0xffffffff;
  local_24 = 0;
  do {
    if (iVar2 <= local_24) {
      if (local_18 != (void *)0x0) {
        local_28 = 0;
        for (local_1c = 0; local_1c < 0x400; local_1c = local_1c + 1) {
          if (local_428[local_1c] != '\0') {
            *(uint32_t *)((long)local_18 + (long)local_28 * 4) = local_1428[local_1c];
            local_28 = local_28 + 1;
          }
        }
        qsort(local_18,(long)local_28,4,PaletteCompareColorsForQsort);
      }
      return local_28;
    }
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      if (local_1430[local_20] != local_143c) {
        local_143c = local_1430[local_20];
        for (local_1440 = VP8LHashPix(local_143c,0x16); local_428[(int)local_1440] != '\0';
            local_1440 = local_1440 + 1 & 0x3ff) {
          if (local_1428[(int)local_1440] == local_143c) goto LAB_00189a98;
        }
        local_1428[(int)local_1440] = local_143c;
        local_428[(int)local_1440] = '\x01';
        local_28 = local_28 + 1;
        if (0x100 < local_28) {
          return 0x101;
        }
      }
LAB_00189a98:
    }
    local_1430 = local_1430 + *(int *)(local_10 + 0x50);
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int GetColorPalette(const WebPPicture* const pic, uint32_t* const palette) {
  int i;
  int x, y;
  int num_colors = 0;
  uint8_t in_use[COLOR_HASH_SIZE] = {0};
  uint32_t colors[COLOR_HASH_SIZE] = {0};
  const uint32_t* argb = pic->argb;
  const int width = pic->width;
  const int height = pic->height;
  uint32_t last_pix = ~argb[0];  // so we're sure that last_pix != argb[0]
  assert(pic != NULL);
  assert(pic->use_argb);

  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      int key;
      if (argb[x] == last_pix) {
        continue;
      }
      last_pix = argb[x];
      key = VP8LHashPix(last_pix, COLOR_HASH_RIGHT_SHIFT);
      while (1) {
        if (!in_use[key]) {
          colors[key] = last_pix;
          in_use[key] = 1;
          ++num_colors;
          if (num_colors > MAX_PALETTE_SIZE) {
            return MAX_PALETTE_SIZE + 1;  // Exact count not needed.
          }
          break;
        } else if (colors[key] == last_pix) {
          break;  // The color is already there.
        } else {
          // Some other color sits here, so do linear conflict resolution.
          ++key;
          key &= (COLOR_HASH_SIZE - 1);  // Key mask.
        }
      }
    }
    argb += pic->argb_stride;
  }

  if (palette != NULL) {  // Fill the colors into palette.
    num_colors = 0;
    for (i = 0; i < COLOR_HASH_SIZE; ++i) {
      if (in_use[i]) {
        palette[num_colors] = colors[i];
        ++num_colors;
      }
    }
    qsort(palette, num_colors, sizeof(*palette), PaletteCompareColorsForQsort);
  }
  return num_colors;
}